

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall Runtime::setVar(Runtime *this,string *name,Data *data)

{
  Data *pDVar1;
  long lVar2;
  
  pDVar1 = getVar(this,name);
  lVar2 = __dynamic_cast(pDVar1,&Data::typeinfo,&Integer::typeinfo,0);
  if (lVar2 != 0) {
    pDVar1[1]._vptr_Data = data[1]._vptr_Data;
  }
  return;
}

Assistant:

void Runtime::setVar(std::string &name, Data *data) {
    auto target = getVar(name);
    if ((dynamic_cast<Integer *>(target)) != NULL) {
        ((Integer *) target)->value = ((Integer *) data)->value;
    }
}